

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float GetDraggedColumnOffset(ImGuiColumns *columns,int column_index)

{
  float fVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  int in_ESI;
  int *in_RDI;
  float fVar4;
  float fVar5;
  float x;
  ImGuiWindow *window;
  ImGuiContext *g;
  float local_24;
  int column_index_00;
  ImGuiWindow *pIVar6;
  
  pIVar3 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  if (in_ESI < 1) {
    __assert_fail("column_index > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0x1d18,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
  }
  if (GImGui->ActiveId == *in_RDI + in_ESI) {
    fVar5 = (GImGui->IO).MousePos.x;
    fVar1 = (GImGui->ActiveIdClickOffset).x;
    fVar2 = (pIVar6->Pos).x;
    fVar4 = ImGui::GetColumnOffset((int)pIVar6);
    column_index_00 = (int)pIVar6;
    local_24 = ImMax<float>(((fVar5 - fVar1) + 4.0) - fVar2,
                            fVar4 + (pIVar3->Style).ColumnsMinSpacing);
    if ((in_RDI[1] & 4U) != 0) {
      fVar5 = ImGui::GetColumnOffset(column_index_00);
      local_24 = ImMin<float>(local_24,fVar5 - (pIVar3->Style).ColumnsMinSpacing);
    }
    return local_24;
  }
  __assert_fail("g.ActiveId == columns->ID + ImGuiID(column_index)",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                ,0x1d19,"float GetDraggedColumnOffset(ImGuiColumns *, int)");
}

Assistant:

static float GetDraggedColumnOffset(ImGuiColumns* columns, int column_index)
{
    // Active (dragged) column always follow mouse. The reason we need this is that dragging a column to the right edge of an auto-resizing
    // window creates a feedback loop because we store normalized positions. So while dragging we enforce absolute positioning.
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(column_index > 0); // We are not supposed to drag column 0.
    IM_ASSERT(g.ActiveId == columns->ID + ImGuiID(column_index));

    float x = g.IO.MousePos.x - g.ActiveIdClickOffset.x + COLUMNS_HIT_RECT_HALF_WIDTH - window->Pos.x;
    x = ImMax(x, ImGui::GetColumnOffset(column_index - 1) + g.Style.ColumnsMinSpacing);
    if ((columns->Flags & ImGuiColumnsFlags_NoPreserveWidths))
        x = ImMin(x, ImGui::GetColumnOffset(column_index + 1) - g.Style.ColumnsMinSpacing);

    return x;
}